

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-defs.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::addElem
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Name param_1,Name *table,
          optional<wasm::Expression_*> offset,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *elems,Index pos)

{
  uint uVar1;
  Module *pMVar2;
  pointer puVar3;
  pointer puVar4;
  Table *pTVar5;
  __uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> _Var6;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  string local_70;
  Err local_50;
  allocator<char> local_29;
  
  pMVar2 = this->wasm;
  uVar1 = this->index;
  puVar3 = (pMVar2->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Expression_*>._M_engaged == true) {
    *(_Storage<wasm::Expression_*,_true> *)
     ((long)puVar3[uVar1]._M_t.
            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
            _M_t + 0x28) =
         offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Expression_*>._M_payload;
    if (table == (Name *)0x0) {
      puVar4 = (pMVar2->tables).
               super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pMVar2->tables).
          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == puVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"active element segment with no table",&local_29);
        Lexer::err(&local_50,&this->in,(ulong)pos,&local_70);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        return __return_storage_ptr__;
      }
      pTVar5 = (puVar4->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
               super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      _Var6._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
           puVar3[uVar1]._M_t.
           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
           _M_t;
      uVar8 = *(undefined4 *)((long)&(pTVar5->super_Importable).super_Named + 4);
      uVar9 = *(undefined4 *)((long)&(pTVar5->super_Importable).super_Named + 8);
      uVar10 = *(undefined4 *)((long)&(pTVar5->super_Importable).super_Named + 0xc);
      *(undefined4 *)
       ((long)_Var6._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x18) =
           *(undefined4 *)&(pTVar5->super_Importable).super_Named;
      *(undefined4 *)
       ((long)_Var6._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x1c) = uVar8;
      *(undefined4 *)
       ((long)_Var6._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x20) = uVar9;
      *(undefined4 *)
       ((long)_Var6._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x24) = uVar10;
      goto code_r0x00c003d4;
    }
    _Var7._M_head_impl =
         *(ElementSegment **)
          &puVar3[uVar1]._M_t.
           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
           _M_t;
    uVar8 = (undefined4)(table->super_IString).str._M_len;
    uVar9 = *(undefined4 *)((long)&(table->super_IString).str._M_len + 4);
    uVar10 = *(undefined4 *)&(table->super_IString).str._M_str;
    uVar11 = *(undefined4 *)((long)&(table->super_IString).str._M_str + 4);
  }
  else {
    *(undefined8 *)
     ((long)puVar3[uVar1]._M_t.
            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
            _M_t + 0x28) = 0;
    _Var7._M_head_impl =
         *(ElementSegment **)
          &puVar3[uVar1]._M_t.
           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
           _M_t;
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
  }
  *(undefined4 *)&(_Var7._M_head_impl)->table = uVar8;
  *(undefined4 *)((long)&(_Var7._M_head_impl)->table + 4) = uVar9;
  *(undefined4 *)((long)&(_Var7._M_head_impl)->table + 8) = uVar10;
  *(undefined4 *)((long)&(_Var7._M_head_impl)->table + 0xc) = uVar11;
code_r0x00c003d4:
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::_M_move_assign
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             ((long)puVar3[uVar1]._M_t.
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t + 0x38),elems);
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDefsCtx::addElem(Name,
                               Name* table,
                               std::optional<Expression*> offset,
                               std::vector<Expression*>&& elems,
                               Index pos) {
  auto& e = wasm.elementSegments[index];
  if (offset) {
    e->offset = *offset;
    if (table) {
      e->table = *table;
    } else if (wasm.tables.size() > 0) {
      e->table = wasm.tables[0]->name;
    } else {
      return in.err(pos, "active element segment with no table");
    }
  } else {
    e->offset = nullptr;
    e->table = Name();
  }
  e->data = std::move(elems);
  return Ok{};
}